

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word.c
# Opt level: O2

int lowerword(int f,int n)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  RSIZE size;
  bool bVar5;
  
  iVar3 = checkdirty(curbp);
  if (iVar3 == 1) {
    if ((curbp->b_flag & 0x10U) == 0) {
      if (n < 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = 1;
        while (bVar5 = n != 0, n = n + -1, bVar5) {
          while (iVar4 = inword(), iVar4 == 0) {
            iVar4 = forwchar(8,1);
            if (iVar4 == 0) {
              return 1;
            }
          }
          size = countfword();
          undo_add_change(curwp->w_dotp,curwp->w_doto,size);
          while (iVar4 = inword(), iVar4 != 0) {
            pcVar2 = curwp->w_dotp->l_text;
            bVar1 = pcVar2[curwp->w_doto];
            if ((cinfo[bVar1] & 2U) != 0) {
              pcVar2[curwp->w_doto] = bVar1 + 0x20;
              lchange(8);
            }
            iVar4 = forwchar(8,1);
            if (iVar4 == 0) {
              return 1;
            }
          }
        }
      }
    }
    else {
      dobeep();
      iVar3 = 0;
      ewprintf("Buffer is read-only");
    }
  }
  return iVar3;
}

Assistant:

int
lowerword(int f, int n)
{
	int	c, s;
	RSIZE	size;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read-only");
		return (FALSE);
	}
	if (n < 0)
		return (FALSE);
	while (n--) {
		while (inword() == FALSE) {
			if (forwchar(FFRAND, 1) == FALSE)
				return (TRUE);
		}
		size = countfword();
		undo_add_change(curwp->w_dotp, curwp->w_doto, size);

		while (inword() != FALSE) {
			c = lgetc(curwp->w_dotp, curwp->w_doto);
			if (ISUPPER(c) != FALSE) {
				c = TOLOWER(c);
				lputc(curwp->w_dotp, curwp->w_doto, c);
				lchange(WFFULL);
			}
			if (forwchar(FFRAND, 1) == FALSE)
				return (TRUE);
		}
	}
	return (TRUE);
}